

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

int __thiscall QDateTimeEditPrivate::closestSection(QDateTimeEditPrivate *this,int pos,bool forward)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  QString *pQVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  const_reference pSVar7;
  byte in_DL;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  SectionNode SVar8;
  int tmp;
  int i;
  QString text;
  QList<QString> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  QVariant *in_stack_ffffffffffffff48;
  QDateTimeEditPrivate *in_stack_ffffffffffffff50;
  int local_94;
  int local_70;
  int local_54;
  char local_50 [32];
  undefined8 local_30;
  undefined8 local_28;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  pQVar4 = QList<QString>::first
                     ((QList<QString> *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  qVar5 = QString::size(pQVar4);
  if (in_ESI < qVar5) {
    local_54 = -2;
    if (bVar1 != 0) {
      local_54 = 0;
    }
  }
  else {
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*in_RDI + 0x110))(&local_20);
    qVar5 = QString::size(&local_20);
    pQVar4 = QList<QString>::last(in_stack_ffffffffffffff38);
    qVar6 = QString::size(pQVar4);
    if (qVar5 - in_ESI < qVar6 + 1) {
      if (bVar1 == 0) {
        qVar5 = QList<QDateTimeParser::SectionNode>::size
                          ((QList<QDateTimeParser::SectionNode> *)(in_RDI + 0x81));
        local_94 = (int)qVar5 + -1;
      }
      else {
        local_94 = -3;
      }
      local_54 = local_94;
    }
    else {
      updateCache(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                  (QString *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      for (local_70 = 0;
          qVar5 = QList<QDateTimeParser::SectionNode>::size
                            ((QList<QDateTimeParser::SectionNode> *)(in_RDI + 0x81)),
          local_70 < qVar5; local_70 = local_70 + 1) {
        in_stack_ffffffffffffff50 = (QDateTimeEditPrivate *)(in_RDI + 0x7b);
        pSVar7 = QList<QDateTimeParser::SectionNode>::at
                           ((QList<QDateTimeParser::SectionNode> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (qsizetype)in_stack_ffffffffffffff38);
        local_30._0_4_ = pSVar7->type;
        local_30._4_4_ = pSVar7->pos;
        local_28._0_4_ = pSVar7->count;
        local_28._4_4_ = pSVar7->zeroesAdded;
        SVar8.count = (undefined4)local_30;
        SVar8.zeroesAdded = local_30._4_4_;
        SVar8._0_8_ = in_stack_ffffffffffffff50;
        iVar2 = QDateTimeParser::sectionPos(SVar8);
        iVar3 = QDateTimeParser::sectionSize((int)in_RDI + 0x3d8);
        if (in_ESI < iVar2 + iVar3) {
          if ((in_ESI < iVar2) && (bVar1 == 0)) {
            local_54 = local_70 + -1;
          }
          else {
            local_54 = local_70;
          }
          goto LAB_0055cb79;
        }
        in_stack_ffffffffffffff48 = (QVariant *)(long)local_70;
        qVar5 = QList<QDateTimeParser::SectionNode>::size
                          ((QList<QDateTimeParser::SectionNode> *)(in_RDI + 0x81));
        if ((in_stack_ffffffffffffff48 == (QVariant *)(qVar5 + -1)) && (iVar2 < in_ESI)) {
          local_54 = local_70;
          goto LAB_0055cb79;
        }
      }
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
                 in_stack_ffffffffffffff44,(char *)in_stack_ffffffffffffff38);
      QMessageLogger::warning
                (local_50,"QDateTimeEdit: Internal Error: closestSection returned NoSection");
      local_54 = -1;
    }
LAB_0055cb79:
    QString::~QString((QString *)0x55cb86);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_54;
}

Assistant:

int QDateTimeEditPrivate::closestSection(int pos, bool forward) const
{
    Q_ASSERT(pos >= 0);
    if (pos < separators.first().size())
        return forward ? 0 : FirstSectionIndex;

    const QString text = displayText();
    if (text.size() - pos < separators.last().size() + 1)
        return forward ? LastSectionIndex : int(sectionNodes.size() - 1);

    updateCache(value, text);
    for (int i=0; i<sectionNodes.size(); ++i) {
        const int tmp = sectionPos(sectionNodes.at(i));
        if (pos < tmp + sectionSize(i)) {
            if (pos < tmp && !forward) {
                return i-1;
            }
            return i;
        } else if (i == sectionNodes.size() - 1 && pos > tmp) {
            return i;
        }
    }
    qWarning("QDateTimeEdit: Internal Error: closestSection returned NoSection");
    return NoSectionIndex;
}